

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O0

void __thiscall UniValue::UniValue(UniValue *this,VType initialType,string *initialStr)

{
  string *initialStr_local;
  VType initialType_local;
  UniValue *this_local;
  
  std::__cxx11::string::string((string *)&this->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector(&this->values);
  this->typ = initialType;
  std::__cxx11::string::operator=((string *)&this->val,(string *)initialStr);
  return;
}

Assistant:

UniValue(UniValue::VType initialType, const std::string& initialStr = "") {
        typ = initialType;
        val = initialStr;
    }